

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode39Reader.cpp
# Opt level: O2

Barcode * __thiscall
ZXing::OneD::Code39Reader::decodePattern
          (Barcode *__return_storage_ptr__,Code39Reader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  Iterator puVar1;
  char cVar2;
  byte bVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  char cVar7;
  int xStart;
  int iVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  ulong uVar10;
  int iVar11;
  size_type sVar12;
  char shiftChars [5];
  string txt;
  string fullASCII;
  Error local_e8;
  string local_b8;
  Error local_98;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [9];
  undefined4 local_4f;
  undefined2 local_4b;
  char local_49;
  FixedSparcePattern<CHAR_LEN,_6> START_PATTERN;
  
  iVar11 = -(uint)(((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x40) ==
                  (undefined1  [12])0x0);
  START_PATTERN._data[0] = 0;
  START_PATTERN._data[1] = 2;
  START_PATTERN._data[2] = 3;
  START_PATTERN._data[3] = 5;
  START_PATTERN._data[4] = 7;
  START_PATTERN._data[5] = 8;
  START_PATTERN._data[6] = 0;
  START_PATTERN._data[7] = 0;
  START_PATTERN._data[8] = 0;
  FindLeftGuard<9,6,true>
            ((PatternView *)&local_e8,(ZXing *)next,(PatternView *)(ulong)(uint)((iVar11 + 4) * 9),
             (int)&START_PATTERN,(FixedPattern<9,_6,_true> *)param_3,6.0);
  next->_base = (Iterator)
                CONCAT71(local_e8._msg.field_2._M_allocated_capacity._1_7_,
                         local_e8._msg.field_2._M_local_buf[0]);
  next->_end = (Iterator)
               CONCAT17(local_e8._msg.field_2._M_local_buf[0xf],
                        CONCAT25(local_e8._msg.field_2._13_2_,
                                 CONCAT41(local_e8._msg.field_2._9_4_,
                                          local_e8._msg.field_2._M_local_buf[8])));
  next->_data = (Iterator)local_e8._msg._M_dataplus._M_p;
  *(size_type *)&next->_size = local_e8._msg._M_string_length;
  bVar6 = PatternView::isValid(next);
  if ((!bVar6) ||
     (cVar7 = RowReader::DecodeNarrowWidePattern<int[44],char[45]>
                        (next,(int (*) [44])CHARACTER_ENCODINGS,
                         (char (*) [45])"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%*"),
     cVar7 != '*')) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  xStart = PatternView::pixelsInFront(next);
  iVar8 = PatternView::sum(next,0);
  txt._M_dataplus._M_p = (pointer)&txt.field_2;
  txt._M_string_length = 0;
  txt.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&txt);
  do {
    if (((next->_data == (Iterator)0x0) ||
        (puVar1 = next->_data + next->_size, next->_data = puVar1, next->_end < puVar1 + next->_size
        )) || (bVar6 = PatternView::skipSingle(next,iVar8 / 2), !bVar6)) goto LAB_0016e5e1;
    RowReader::DecodeNarrowWidePattern<int[44],char[45]>
              (next,(int (*) [44])CHARACTER_ENCODINGS,
               (char (*) [45])"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%*");
    std::__cxx11::string::push_back((char)&txt);
    if (txt._M_dataplus._M_p[txt._M_string_length - 1] == '\0') goto LAB_0016e5e1;
  } while (txt._M_dataplus._M_p[txt._M_string_length - 1] != '*');
  std::__cxx11::string::pop_back();
  if (((int)txt._M_string_length < iVar11 + 2) ||
     (bVar6 = PatternView::hasQuietZoneAfter<true>(next,0.5), !bVar6)) {
LAB_0016e5e1:
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    goto LAB_0016e5fd;
  }
  cVar7 = txt._M_dataplus._M_p[txt._M_string_length - 1];
  std::__cxx11::string::pop_back();
  sVar5 = txt._M_string_length;
  _Var4 = txt._M_dataplus;
  iVar11 = 0;
  for (sVar12 = 0; sVar5 != sVar12; sVar12 = sVar12 + 1) {
    iVar8 = IndexOf("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%*",_Var4._M_p[sVar12]);
    iVar11 = iVar11 + iVar8;
  }
  cVar2 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%*"[iVar11 % 0x2b];
  if (cVar7 != cVar2) {
    std::__cxx11::string::push_back((char)&txt);
  }
  builtin_strncpy(shiftChars,"$%/+",5);
  if ((undefined1  [12])((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x20)
      == (undefined1  [12])0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullASCII,"",(allocator<char> *)&local_e8);
  }
  else {
    std::__cxx11::string::string((string *)&local_b8,(string *)&txt);
    DecodeCode39AndCode93FullASCII(&fullASCII,&local_b8,shiftChars);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if ((fullASCII._M_string_length == 0) ||
     (_Var9 = std::
              find_first_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char_const*>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )txt._M_dataplus._M_p,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(txt._M_dataplus._M_p + txt._M_string_length),shiftChars,shiftChars + 4),
     _Var9._M_current == txt._M_dataplus._M_p + txt._M_string_length)) {
    uVar10 = 0;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&txt);
    uVar10 = 2;
  }
  if (cVar7 == cVar2) {
    std::__cxx11::string::push_back((char)&txt);
LAB_0016e78f:
    local_e8._msg._M_dataplus._M_p = (pointer)&local_e8._msg.field_2;
    local_e8._msg.field_2._M_local_buf[0] = '\0';
    local_e8._msg.field_2._M_allocated_capacity._1_7_ = 0;
    local_e8._msg.field_2._M_local_buf[8] = '\0';
    local_e8._msg.field_2._9_4_ = 0;
    local_e8._msg.field_2._13_2_ = 0;
    local_e8._msg.field_2._M_local_buf[0xf] = '\0';
    local_e8._msg._M_string_length = 0;
    local_e8._file = (char *)0x0;
    local_e8._line = -1;
    local_e8._type = None;
    local_e8._43_5_ = 0;
  }
  else {
    if (((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x40) ==
        (undefined1  [12])0x0) goto LAB_0016e78f;
    local_68 = local_58;
    local_e8._msg._M_dataplus._M_p = (pointer)&local_e8._msg.field_2;
    local_e8._msg.field_2._M_local_buf[0] = '\0';
    local_e8._msg.field_2._M_allocated_capacity._1_7_ = (undefined7)local_58._1_8_;
    local_e8._msg.field_2._M_local_buf[8] = SUB81(local_58._1_8_,7);
    local_e8._msg.field_2._9_4_ = local_4f;
    local_e8._msg.field_2._13_2_ = local_4b;
    local_e8._msg.field_2._M_local_buf[0xf] = local_49;
    local_e8._msg._M_string_length = 0;
    local_60 = 0;
    local_58[0] = 0;
    local_e8._file = "src/oned/ODCode39Reader.cpp";
    local_e8._40_3_ = 0x20084;
    std::__cxx11::string::~string((string *)&local_68);
  }
  bVar3 = (&DAT_0019f588)[uVar10 | cVar7 == cVar2];
  iVar11 = PatternView::pixelsTillEnd(next);
  Error::Error(&local_98,&local_e8);
  Result::Result(__return_storage_ptr__,&txt,rowNumber,xStart,iVar11,Code39,
                 (SymbologyIdentifier)((uint)bVar3 << 8 | 0x41),&local_98,false);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&fullASCII);
LAB_0016e5fd:
  std::__cxx11::string::~string((string *)&txt);
  return __return_storage_ptr__;
}

Assistant:

Barcode Code39Reader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<RowReader::DecodingState>&) const
{
	// minimal number of characters that must be present (including start, stop and checksum characters)
	int minCharCount = _opts.validateCode39CheckSum() ? 4 : 3;
	auto isStartOrStopSymbol = [](char c) { return c == '*'; };

	// provide the indices with the narrow bars/spaces which have to be equally wide
	constexpr auto START_PATTERN = FixedSparcePattern<CHAR_LEN, 6>{0, 2, 3, 5, 7, 8};
	// quiet zone is half the width of a character symbol
	constexpr float QUIET_ZONE_SCALE = 0.5f;

	next = FindLeftGuard(next, minCharCount * CHAR_LEN, START_PATTERN, QUIET_ZONE_SCALE * 12);
	if (!next.isValid())
		return {};

	if (!isStartOrStopSymbol(DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET))) // read off the start pattern
		return {};

	int xStart = next.pixelsInFront();
	int maxInterCharacterSpace = next.sum() / 2; // spec actually says 1 narrow space, width/2 is about 4

	std::string txt;
	txt.reserve(20);

	do {
		// check remaining input width and inter-character space
		if (!next.skipSymbol() || !next.skipSingle(maxInterCharacterSpace))
			return {};

		txt += DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET);
		if (txt.back() == 0)
			return {};
	} while (!isStartOrStopSymbol(txt.back()));

	txt.pop_back(); // remove asterisk

	// check txt length and whitespace after the last char. See also FindStartPattern.
	if (Size(txt) < minCharCount - 2 || !next.hasQuietZoneAfter(QUIET_ZONE_SCALE))
		return {};

	auto lastChar = txt.back();
	txt.pop_back();
	int checksum = TransformReduce(txt, 0, [](char c) { return IndexOf(ALPHABET, c); });
	bool hasValidCheckSum = lastChar == ALPHABET[checksum % 43];
	if (!hasValidCheckSum)
		txt.push_back(lastChar);

	const char shiftChars[] = "$%/+";
	auto fullASCII = _opts.tryCode39ExtendedMode() ? DecodeCode39AndCode93FullASCII(txt, shiftChars) : "";
	bool hasFullASCII = !fullASCII.empty() && std::find_first_of(txt.begin(), txt.end(), shiftChars, shiftChars + 4) != txt.end();
	if (hasFullASCII)
		txt = fullASCII;

	if (hasValidCheckSum)
		txt.push_back(lastChar);

	Error error = _opts.validateCode39CheckSum() && !hasValidCheckSum ? ChecksumError() : Error();

	// Symbology identifier modifiers ISO/IEC 16388:2007 Annex C Table C.1
	constexpr const char symbologyModifiers[4] = { '0', '1' /*checksum*/, '4' /*full ASCII*/, '5' /*checksum + full ASCII*/ };
	SymbologyIdentifier symbologyIdentifier = {'A', symbologyModifiers[(int)hasValidCheckSum + 2 * (int)hasFullASCII]};

	int xStop = next.pixelsTillEnd();
	return {std::move(txt), rowNumber, xStart, xStop, BarcodeFormat::Code39, symbologyIdentifier, error};
}